

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_best_score(acmod_t *acmod,int *out_best_senid)

{
  short *local_28;
  int16 *senscr;
  int best;
  int i;
  int *out_best_senid_local;
  acmod_t *acmod_local;
  
  senscr._0_4_ = 0x7fff;
  if (acmod->compallsen == '\0') {
    local_28 = acmod->senone_scores;
    for (senscr._4_4_ = 0; senscr._4_4_ < acmod->n_senone_active; senscr._4_4_ = senscr._4_4_ + 1) {
      local_28 = local_28 + (int)(uint)acmod->senone_active[senscr._4_4_];
      if (*local_28 < (int)senscr) {
        senscr._0_4_ = (int)*local_28;
        *out_best_senid = senscr._4_4_;
      }
    }
  }
  else {
    for (senscr._4_4_ = 0; senscr._4_4_ < acmod->mdef->n_sen; senscr._4_4_ = senscr._4_4_ + 1) {
      if (acmod->senone_scores[senscr._4_4_] < (int)senscr) {
        senscr._0_4_ = (int)acmod->senone_scores[senscr._4_4_];
        *out_best_senid = senscr._4_4_;
      }
    }
  }
  return (int)senscr;
}

Assistant:

int
acmod_best_score(acmod_t *acmod, int *out_best_senid)
{
    int i, best;

    best = SENSCR_DUMMY;
    if (acmod->compallsen) {
        for (i = 0; i < bin_mdef_n_sen(acmod->mdef); ++i) {
            if (acmod->senone_scores[i] < best) {
                best = acmod->senone_scores[i];
                *out_best_senid = i;
            }
        }
    }
    else {
        int16 *senscr;
        senscr = acmod->senone_scores;
        for (i = 0; i < acmod->n_senone_active; ++i) {
            senscr += acmod->senone_active[i];
            if (*senscr < best) {
                best = *senscr;
                *out_best_senid = i;
            }
        }
    }
    return best;
}